

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void counting_callback_fn(char *str,void *data)

{
  int *in_RSI;
  int32_t *p;
  
  if (*in_RSI == 0x7fffffff) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x56,"test condition failed: *p != INT32_MAX");
    abort();
  }
  *in_RSI = *in_RSI + 1;
  return;
}

Assistant:

static void counting_callback_fn(const char* str, void* data) {
    /* Dummy callback function that just counts. */
    int32_t *p;
    (void)str;
    p = data;
    CHECK(*p != INT32_MAX);
    (*p)++;
}